

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedLinearAllocator.hpp
# Opt level: O2

void __thiscall
Diligent::FixedLinearAllocator::AddSpace(FixedLinearAllocator *this,size_t size,size_t alignment)

{
  size_t sVar1;
  string msg;
  size_t alignment_local;
  size_t size_local;
  
  alignment_local = alignment;
  size_local = size;
  if (this->m_pDataStart != (uint8_t *)0x0) {
    FormatString<char[46]>(&msg,(char (*) [46])"Memory has already been allocated or assigned");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"AddSpace",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
               ,0x95);
    std::__cxx11::string::~string((string *)&msg);
  }
  if ((alignment ^ alignment - 1) <= alignment - 1) {
    FormatString<char[33]>(&msg,(char (*) [33])"Alignment is not a power of two!");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"AddSpace",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
               ,0x96);
    std::__cxx11::string::~string((string *)&msg);
  }
  if (size != 0) {
    sVar1 = this->m_CurrAlignment;
    if (sVar1 == 0) {
      sVar1 = 8;
      if (this->m_ReservedSize != 0) {
        FormatString<char[60]>
                  (&msg,(char (*) [60])"This is expected to be a very first time the space is added"
                  );
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"AddSpace",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
                   ,0x9d);
        std::__cxx11::string::~string((string *)&msg);
      }
    }
    if (sVar1 <= alignment && alignment - sVar1 != 0) {
      this->m_ReservedSize = this->m_ReservedSize + (alignment - sVar1);
    }
    this->m_CurrAlignment = alignment;
    size_local = AlignUp<unsigned_long,unsigned_long>(size,alignment);
    this->m_ReservedSize = this->m_ReservedSize + size_local;
    std::
    vector<Diligent::FixedLinearAllocator::DbgAllocationInfo,std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>>
    ::emplace_back<unsigned_long&,unsigned_long&,unsigned_long&>
              ((vector<Diligent::FixedLinearAllocator::DbgAllocationInfo,std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>>
                *)&this->m_DbgAllocations,&size_local,&alignment_local,&this->m_ReservedSize);
  }
  return;
}

Assistant:

void AddSpace(size_t size, size_t alignment = 1) noexcept
    {
        VERIFY(m_pDataStart == nullptr, "Memory has already been allocated or assigned");
        VERIFY(IsPowerOfTwo(alignment), "Alignment is not a power of two!");

        if (size == 0)
            return;

        if (m_CurrAlignment == 0)
        {
            VERIFY(m_ReservedSize == 0, "This is expected to be a very first time the space is added");
            m_CurrAlignment = sizeof(void*);
        }

        if (alignment > m_CurrAlignment)
        {
            // Reserve extra space that may be needed for alignment
            m_ReservedSize += alignment - m_CurrAlignment;
        }
        m_CurrAlignment = alignment;

        size = AlignUp(size, alignment);
        m_ReservedSize += size;

#if DILIGENT_DEBUG
        m_DbgAllocations.emplace_back(size, alignment, m_ReservedSize);
#endif
    }